

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

unsigned_long __thiscall acto::core::runtime_t::release(runtime_t *this,object_t *obj)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  unsigned_long uVar3;
  
  if (obj == (object_t *)0x0) {
    __assert_fail("obj",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0xe4,"unsigned long acto::core::runtime_t::release(object_t *const)");
  }
  if ((obj->references).super___atomic_base<unsigned_long>._M_i != 0) {
    LOCK();
    paVar1 = &obj->references;
    _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    uVar3 = _Var2 - 1;
    if (uVar3 == 0) {
      deconstruct_object(this,obj);
    }
    return uVar3;
  }
  __assert_fail("obj->references",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0xe5,"unsigned long acto::core::runtime_t::release(object_t *const)");
}

Assistant:

unsigned long runtime_t::release(object_t* const obj) {
  assert(obj);
  assert(obj->references);

  const long result = --obj->references;

  if (result == 0) {
    deconstruct_object(obj);
  }

  return result;
}